

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_manager_shared.c
# Opt level: O0

void apx_fileManagerShared_disconnected(apx_fileManagerShared_t *self)

{
  apx_fileManagerShared_t *self_local;
  
  if (self != (apx_fileManagerShared_t *)0x0) {
    pthread_mutex_lock((pthread_mutex_t *)&self->lock);
    self->is_connected = false;
    pthread_mutex_unlock((pthread_mutex_t *)&self->lock);
  }
  return;
}

Assistant:

void apx_fileManagerShared_disconnected(apx_fileManagerShared_t* self)
{
   if (self != NULL)
   {
      MUTEX_LOCK(self->lock);
      self->is_connected = false;
      MUTEX_UNLOCK(self->lock);
#if APX_DEBUG_ENABLE
      printf("[FILE-MANAGER %u] Disabled transmit handler\n", (unsigned int) self->connection_id);
#endif
   }
}